

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::PushClipRect
          (ImDrawList *this,ImVec2 cr_min,ImVec2 cr_max,bool intersect_with_current_clip_rect)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  byte in_SIL;
  ImVec4 *in_RDI;
  float fVar7;
  float fVar8;
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  ImVec4 current;
  ImVec4 cr;
  undefined4 in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  float fStack_38;
  float local_34;
  float in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd4;
  float fStack_28;
  float local_24;
  float fStack_20;
  float local_10;
  float fStack_c;
  float local_8;
  float fStack_4;
  
  uVar1 = vmovlpd_avx(in_ZMM0._0_16_);
  uVar2 = vmovlpd_avx(in_ZMM1._0_16_);
  local_8 = (float)uVar1;
  fStack_4 = (float)((ulong)uVar1 >> 0x20);
  local_10 = (float)uVar2;
  fStack_c = (float)((ulong)uVar2 >> 0x20);
  ImVec4::ImVec4((ImVec4 *)&stack0xffffffffffffffd4,local_8,fStack_4,local_10,fStack_c);
  if ((in_SIL & 1) != 0) {
    uVar3 = in_RDI[8].z;
    uVar5 = in_RDI[8].w;
    uVar4 = in_RDI[9].x;
    uVar6 = in_RDI[9].y;
    if (in_stack_ffffffffffffffd4 < (float)uVar3) {
      in_stack_ffffffffffffffd4 = (float)uVar3;
    }
    if (fStack_28 < (float)uVar5) {
      fStack_28 = (float)uVar5;
    }
    if ((float)uVar4 < local_24) {
      local_24 = (float)uVar4;
    }
    in_stack_ffffffffffffffc4 = (float)uVar3;
    in_stack_ffffffffffffffd0 = (float)uVar6;
    if ((float)uVar6 < fStack_20) {
      fStack_20 = (float)uVar6;
    }
  }
  fVar7 = ImMax<float>(in_stack_ffffffffffffffd4,local_24);
  fVar8 = ImMax<float>(fStack_28,fStack_20);
  ImVector<ImVec4>::push_back
            ((ImVector<ImVec4> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_RDI);
  in_RDI[8].z = in_stack_ffffffffffffffd4;
  in_RDI[8].w = fStack_28;
  in_RDI[9].x = fVar7;
  in_RDI[9].y = fVar8;
  _OnChangedClipRect((ImDrawList *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  return;
}

Assistant:

void ImDrawList::PushClipRect(ImVec2 cr_min, ImVec2 cr_max, bool intersect_with_current_clip_rect)
{
    ImVec4 cr(cr_min.x, cr_min.y, cr_max.x, cr_max.y);
    if (intersect_with_current_clip_rect)
    {
        ImVec4 current = _CmdHeader.ClipRect;
        if (cr.x < current.x) cr.x = current.x;
        if (cr.y < current.y) cr.y = current.y;
        if (cr.z > current.z) cr.z = current.z;
        if (cr.w > current.w) cr.w = current.w;
    }
    cr.z = ImMax(cr.x, cr.z);
    cr.w = ImMax(cr.y, cr.w);

    _ClipRectStack.push_back(cr);
    _CmdHeader.ClipRect = cr;
    _OnChangedClipRect();
}